

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  int iVar1;
  bool bVar2;
  cmWorkingDirectory workdir;
  ifstream fin;
  allocator local_271;
  string local_270;
  cmWorkingDirectory local_250;
  long local_230 [4];
  byte abStack_210 [488];
  
  cmWorkingDirectory::cmWorkingDirectory(&local_250,&this->CompileDirectory);
  std::ifstream::ifstream(local_230,internalFile,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    iVar1 = (*this->_vptr_cmDepends[3])(this,local_230,internalFile,validDeps);
    bVar2 = true;
    if ((char)iVar1 != '\0') goto LAB_00454fa0;
  }
  Clear(this,makeFile);
  std::__cxx11::string::string((string *)&local_270,internalFile,&local_271);
  cmsys::SystemTools::RemoveFile(&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_00454fa0:
  std::ifstream::~ifstream(local_230);
  cmWorkingDirectory::~cmWorkingDirectory(&local_250);
  return bVar2;
}

Assistant:

bool cmDepends::Check(const char* makeFile, const char* internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  cmWorkingDirectory workdir(this->CompileDirectory);

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
  }

  return okay;
}